

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateArrayAllocation(ExpressionContext *ctx,SynBase *source,TypeBase *type,ExprBase *count)

{
  TypeBase *pTVar1;
  TypeBase *source_00;
  SynBase *ctx_00;
  bool bVar2;
  ExprIntegerLiteral *this;
  ExprFunctionCall *this_00;
  ExprTypeLiteral *this_01;
  ExprBase *node;
  ExpressionContext *this_02;
  TypeUnsizedArray *type_00;
  InplaceStr local_58;
  ExpressionContext *local_48;
  ExprFunctionCall *alloc;
  ExprBase *typeId;
  ExprBase *size;
  ExprBase *count_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  size = count;
  count_local = (ExprBase *)type;
  type_local = (TypeBase *)source;
  source_local = (SynBase *)ctx;
  this = ExpressionContext::get<ExprIntegerLiteral>(ctx);
  ExprIntegerLiteral::ExprIntegerLiteral
            (this,(SynBase *)type_local,(TypeBase *)source_local[0x227].end,
             (longlong)count_local[1]._vptr_ExprBase);
  typeId = &this->super_ExprBase;
  this_00 = (ExprFunctionCall *)
            ExpressionContext::get<ExprTypeCast>((ExpressionContext *)source_local);
  source_00 = type_local;
  pTVar1 = (TypeBase *)source_local[0x227].end;
  this_01 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
  ExprTypeLiteral::ExprTypeLiteral
            (this_01,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
             (TypeBase *)count_local);
  ExprTypeCast::ExprTypeCast
            ((ExprTypeCast *)this_00,(SynBase *)source_00,pTVar1,&this_01->super_ExprBase,
             EXPR_CAST_REINTERPRET);
  alloc = this_00;
  size = CreateCast((ExpressionContext *)source_local,(SynBase *)type_local,size,
                    (TypeBase *)source_local[0x227].end,true);
  ctx_00 = source_local;
  pTVar1 = type_local;
  InplaceStr::InplaceStr(&local_58,"__newA");
  node = CreateFunctionCall3((ExpressionContext *)ctx_00,(SynBase *)pTVar1,local_58,typeId,size,
                             &alloc->super_ExprBase,false,true,true);
  local_48 = (ExpressionContext *)getType<ExprFunctionCall>(node);
  bVar2 = isType<TypeError>((TypeBase *)count_local);
  if (bVar2) {
    ctx_local = local_48;
  }
  else {
    if (0xffff < (long)count_local[1]._vptr_ExprBase) {
      anon_unknown.dwarf_e7629::Stop
                ((ExpressionContext *)source_local,(SynBase *)type_local,
                 "ERROR: array element size cannot exceed 65535 bytes");
    }
    this_02 = (ExpressionContext *)
              ExpressionContext::get<ExprTypeCast>((ExpressionContext *)source_local);
    pTVar1 = type_local;
    type_00 = ExpressionContext::GetUnsizedArrayType
                        ((ExpressionContext *)source_local,(TypeBase *)count_local);
    ExprTypeCast::ExprTypeCast
              ((ExprTypeCast *)this_02,(SynBase *)pTVar1,(TypeBase *)type_00,(ExprBase *)local_48,
               EXPR_CAST_REINTERPRET);
    ctx_local = this_02;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateArrayAllocation(ExpressionContext &ctx, SynBase *source, TypeBase *type, ExprBase *count)
{
	ExprBase *size = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, type->size);
	ExprBase *typeId = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeInt, new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, type), EXPR_CAST_REINTERPRET);

	count = CreateCast(ctx, source, count, ctx.typeInt, true);

	ExprFunctionCall *alloc = getType<ExprFunctionCall>(CreateFunctionCall3(ctx, source, InplaceStr("__newA"), size, count, typeId, false, true, true));

	if(isType<TypeError>(type))
		return alloc;

	if(type->size >= 64 * 1024)
		Stop(ctx, source, "ERROR: array element size cannot exceed 65535 bytes");

	return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetUnsizedArrayType(type), alloc, EXPR_CAST_REINTERPRET);
}